

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_buffer.h
# Opt level: O1

StringBuffer * __thiscall MeCab::StringBuffer::operator<<(StringBuffer *this,short n)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  StringBuffer *pSVar4;
  char *pcVar5;
  char *__n;
  uint uVar6;
  ulong in_RDX;
  char *__buf;
  uint uVar7;
  bool bVar8;
  char fbuf [64];
  char local_48;
  char local_47 [71];
  
  uVar7 = (uint)(ushort)n;
  pcVar3 = &local_48;
  if (n < 0) {
    pcVar3 = local_47;
    local_48 = '-';
    uVar7 = -(uint)(ushort)n;
  }
  pcVar5 = pcVar3;
  if ((short)uVar7 != 0) {
    do {
      uVar2 = (int)(short)uVar7 / 10;
      *pcVar5 = (char)uVar7 + (char)uVar2 * -10 + '0';
      pcVar5 = pcVar5 + 1;
      uVar6 = (int)(short)uVar7 + 9;
      in_RDX = (ulong)uVar6;
      uVar7 = uVar2;
    } while (0x12 < uVar6);
  }
  if (pcVar3 == pcVar5) {
    *pcVar5 = '0';
    pcVar5 = pcVar5 + 1;
  }
  *pcVar5 = '\0';
  __buf = (char *)CONCAT71((int7)(in_RDX >> 8),pcVar3 != pcVar5);
  __n = pcVar5 + -1;
  if (pcVar3 < __n && pcVar3 != pcVar5) {
    pcVar3 = pcVar3 + 1;
    do {
      cVar1 = pcVar3[-1];
      pcVar3[-1] = *__n;
      *__n = cVar1;
      __n = __n + -1;
      __buf = pcVar3 + 1;
      bVar8 = pcVar3 < __n;
      pcVar3 = __buf;
    } while (bVar8);
  }
  pSVar4 = (StringBuffer *)write(this,(int)&local_48,__buf,(size_t)__n);
  return pSVar4;
}

Assistant:

StringBuffer& operator<<(short int n)          { _ITOA(n); }